

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O2

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CClass *stm)

{
  shared_ptr<ClassInfo> *this_00;
  CIdExp *pCVar1;
  CFieldList *pCVar2;
  CMethodList *pCVar3;
  bool bVar4;
  __shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  ostream *poVar6;
  string *this_01;
  undefined1 local_88 [8];
  _Alloc_hider a_Stack_80 [6];
  __shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  this_01 = (string *)local_88;
  std::operator<<((ostream *)&std::cout,"typechecker: class\n");
  pCVar1 = (stm->id)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
           super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
           super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
  if (((pCVar1 == (CIdExp *)0x0) ||
      ((stm->fields)._M_t.super___uniq_ptr_impl<CFieldList,_std::default_delete<CFieldList>_>._M_t.
       super__Tuple_impl<0UL,_CFieldList_*,_std::default_delete<CFieldList>_>.
       super__Head_base<0UL,_CFieldList_*,_false>._M_head_impl == (CFieldList *)0x0)) ||
     ((stm->methods)._M_t.super___uniq_ptr_impl<CMethodList,_std::default_delete<CMethodList>_>._M_t
      .super__Tuple_impl<0UL,_CMethodList_*,_std::default_delete<CMethodList>_>.
      super__Head_base<0UL,_CMethodList_*,_false>._M_head_impl == (CMethodList *)0x0)) {
    CError::CError((CError *)local_88,&CError::AST_ERROR_abi_cxx11_,
                   &(stm->super_IWrapper).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
              (&this->errors,(CError *)local_88);
  }
  else {
    p_Var5 = &std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)(this->table).
                              super___shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           &pCVar1->name)->super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>
    ;
    this_00 = &this->currentClass;
    std::__shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&this_00->super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>,p_Var5);
    std::operator<<((ostream *)&std::cout,"Before cyclic check\n");
    std::__shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,&this_00->super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,&this_00->super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>);
    bVar4 = checkCyclicInheritance
                      (this,(shared_ptr<ClassInfo> *)&local_40,(shared_ptr<ClassInfo> *)&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    poVar6 = std::operator<<((ostream *)&std::cout,"Cyclic inheritance was checked for class: ");
    poVar6 = std::operator<<(poVar6,(string *)
                                    (this_00->
                                    super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>).
                                    _M_ptr);
    std::operator<<(poVar6,"\n");
    if (bVar4) {
      CError::CError((CError *)local_88,&CError::CYCLIC_INHERITANCE_abi_cxx11_,
                     (PositionInfo *)
                     ((long)&(((stm->parentClass)._M_t.
                               super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
                               super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
                               super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl)->
                             super_IExpression).super_PositionedNode + 8));
      std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
                (&this->errors,(CError *)local_88);
      std::__cxx11::string::~string((string *)local_88);
      return;
    }
    pCVar1 = (stm->id)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
             super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
             super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
    (*(code *)**(undefined8 **)&(pCVar1->super_IExpression).super_PositionedNode)(pCVar1,this);
    pCVar2 = (stm->fields)._M_t.super___uniq_ptr_impl<CFieldList,_std::default_delete<CFieldList>_>.
             _M_t.super__Tuple_impl<0UL,_CFieldList_*,_std::default_delete<CFieldList>_>.
             super__Head_base<0UL,_CFieldList_*,_false>._M_head_impl;
    (*(code *)**(undefined8 **)&(pCVar2->super_IWrapper).super_PositionedNode)(pCVar2,this);
    pCVar3 = (stm->methods)._M_t.
             super___uniq_ptr_impl<CMethodList,_std::default_delete<CMethodList>_>._M_t.
             super__Tuple_impl<0UL,_CMethodList_*,_std::default_delete<CMethodList>_>.
             super__Head_base<0UL,_CMethodList_*,_false>._M_head_impl;
    (*(code *)**(undefined8 **)&(pCVar3->super_IWrapper).super_PositionedNode)(pCVar3,this);
    TypeInfo::TypeInfo((TypeInfo *)local_88,VOID);
    TypeInfo::operator=(&this->lastCalculatedType,(TypeInfo *)local_88);
    this_01 = (string *)a_Stack_80;
  }
  std::__cxx11::string::~string(this_01);
  local_88 = (undefined1  [8])0x0;
  a_Stack_80[0]._M_p = (pointer)0x0;
  std::__shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->currentClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2> *)local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)a_Stack_80);
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CClass &stm ) 
{
	std::cout << "typechecker: class\n";
    if( stm.id && stm.fields && stm.methods ) {
        currentClass = table->classes[stm.id->name];
        std::cout << "Before cyclic check\n";
        bool isBadInherited = checkCyclicInheritance( currentClass, currentClass );
        std::cout << "Cyclic inheritance was checked for class: " << currentClass->name << "\n";
        if( isBadInherited ) {
            errors.push_back( CError( CError::CYCLIC_INHERITANCE, stm.parentClass->position ) );
            return;
        }
        stm.id->Accept( *this );
        stm.fields->Accept( *this );
        stm.methods->Accept( *this );
        lastCalculatedType = enums::TPrimitiveType::VOID;
    } else {
        errors.push_back( CError( CError::AST_ERROR, stm.position ) );
    }
    currentClass = nullptr;
}